

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

termline * newtermline(Terminal *term,wchar_t cols,_Bool bce)

{
  unsigned_long *puVar1;
  truecolour *ptVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  wchar_t wVar5;
  undefined4 uVar6;
  termline *ptVar7;
  termchar *ptVar8;
  long lVar9;
  
  ptVar7 = (termline *)safemalloc(1,0x28,0);
  ptVar8 = (termchar *)safemalloc((long)cols,0x20,0);
  ptVar7->chars = ptVar8;
  if (L'\0' < cols) {
    lVar9 = 0;
    do {
      ptVar8 = ptVar7->chars;
      uVar3 = (&term->basic_erase_char)[bce].chr;
      uVar4 = (&term->basic_erase_char)[bce].attr;
      wVar5 = (&term->basic_erase_char)[bce].cc_next;
      uVar6 = *(undefined4 *)&(&term->basic_erase_char)[bce].field_0x1c;
      ptVar2 = (truecolour *)(&(ptVar8->truecolour).fg.enabled + lVar9);
      *ptVar2 = (&term->basic_erase_char)[bce].truecolour;
      ptVar2[1].fg.enabled = (_Bool)(char)wVar5;
      ptVar2[1].fg.r = (char)((uint)wVar5 >> 8);
      ptVar2[1].fg.g = (char)((uint)wVar5 >> 0x10);
      ptVar2[1].fg.b = (char)((uint)wVar5 >> 0x18);
      ptVar2[1].bg.enabled = (_Bool)(char)uVar6;
      ptVar2[1].bg.r = (char)((uint)uVar6 >> 8);
      ptVar2[1].bg.g = (char)((uint)uVar6 >> 0x10);
      ptVar2[1].bg.b = (char)((uint)uVar6 >> 0x18);
      puVar1 = (unsigned_long *)((long)&ptVar8->chr + lVar9);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      lVar9 = lVar9 + 0x20;
    } while ((ulong)(uint)cols << 5 != lVar9);
  }
  ptVar7->size = cols;
  ptVar7->cols = cols;
  ptVar7->lattr = 0;
  ptVar7->trusted = false;
  ptVar7->temporary = false;
  ptVar7->cc_free = L'\0';
  return ptVar7;
}

Assistant:

static termline *newtermline(Terminal *term, int cols, bool bce)
{
    termline *line;
    int j;

    line = snew(termline);
    line->chars = snewn(cols, termchar);
    for (j = 0; j < cols; j++)
        line->chars[j] = (bce ? term->erase_char : term->basic_erase_char);
    line->cols = line->size = cols;
    line->lattr = LATTR_NORM;
    line->trusted = false;
    line->temporary = false;
    line->cc_free = 0;

    return line;
}